

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O2

void menu_bar_inter_interim_do_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object old_object;
  Am_Object new_object;
  Am_Object old_object_win;
  Am_Object menu_bar_win;
  Am_Object local_20;
  Am_Object main_item;
  Am_Object new_object_win;
  
  old_object.data = (Am_Object_Data *)0x0;
  new_object.data = (Am_Object_Data *)0x0;
  menu_bar_win.data = (Am_Object_Data *)0x0;
  old_object_win.data = (Am_Object_Data *)0x0;
  new_object_win.data = (Am_Object_Data *)0x0;
  main_item.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)inter);
  pAVar2 = Am_Object::Get(&local_20,0x68,0);
  Am_Object::operator=(&menu_bar_win,pAVar2);
  Am_Object::~Am_Object(&local_20);
  pAVar2 = Am_Object::Get(inter,0x16b,0);
  Am_Object::operator=(&old_object,pAVar2);
  pAVar2 = Am_Object::Get(inter,0x16a,0);
  Am_Object::operator=(&new_object,pAVar2);
  bVar1 = Am_Object::Valid(&new_object);
  if (bVar1) {
    Am_Object::Set(&new_object,0x173,true,0);
  }
  bVar1 = Am_Object::Valid(&old_object);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&old_object,0x68,0);
    Am_Object::operator=(&old_object_win,pAVar2);
    bVar1 = Am_Object::operator!=(&old_object_win,&menu_bar_win);
    if (bVar1) {
      Am_Object::Set(&old_object,0x173,false,0);
    }
  }
  Am_Object::~Am_Object(&main_item);
  Am_Object::~Am_Object(&new_object_win);
  Am_Object::~Am_Object(&old_object_win);
  Am_Object::~Am_Object(&menu_bar_win);
  Am_Object::~Am_Object(&new_object);
  Am_Object::~Am_Object(&old_object);
  return;
}

Assistant:

Am_Define_Object_Formula(popup_sub_win_undo_handler)
{
  Am_Object for_item, main_window, undo_handler;
  for_item = self.Get(Am_FOR_ITEM);
  if (for_item.Valid()) {
    Am_Value v;
    v = for_item.Peek(Am_WINDOW);
    if (v.Valid()) {
      main_window = v;
      if (main_window.Valid()) {
        v = main_window.Peek(Am_UNDO_HANDLER);
        if (v.Valid())
          undo_handler = v;
      }
    }
  }
  return undo_handler;
}